

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

void gflags::GetAllFlags(vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>
                         *OUTPUT)

{
  bool bVar1;
  pointer ppVar2;
  iterator iVar3;
  iterator iVar4;
  undefined1 local_108 [8];
  CommandLineFlagInfo fi;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  local_30;
  iterator local_28;
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  local_20;
  FlagConstIterator i;
  FlagRegistry *registry;
  vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_> *OUTPUT_local;
  
  i._M_node = (_Base_ptr)anon_unknown_2::FlagRegistry::GlobalRegistry();
  anon_unknown_2::FlagRegistry::Lock((FlagRegistry *)i._M_node);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
       ::begin(i._M_node);
  std::
  _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
  ::_Rb_tree_const_iterator(&local_20,&local_28);
  while( true ) {
    fi.flag_ptr = (void *)std::
                          map<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
                          ::end((map<const_char_*,_gflags::(anonymous_namespace)::CommandLineFlag_*,_gflags::(anonymous_namespace)::StringCmp,_std::allocator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>_>
                                 *)i._M_node);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
    ::_Rb_tree_const_iterator(&local_30,(iterator *)&fi.flag_ptr);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    CommandLineFlagInfo::CommandLineFlagInfo((CommandLineFlagInfo *)local_108);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
             ::operator->(&local_20);
    anon_unknown_2::CommandLineFlag::FillCommandLineFlagInfo
              (ppVar2->second,(CommandLineFlagInfo *)local_108);
    std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
    push_back(OUTPUT,(value_type *)local_108);
    CommandLineFlagInfo::~CommandLineFlagInfo((CommandLineFlagInfo *)local_108);
    std::
    _Rb_tree_const_iterator<std::pair<const_char_*const,_gflags::(anonymous_namespace)::CommandLineFlag_*>_>
    ::operator++(&local_20);
  }
  anon_unknown_2::FlagRegistry::Unlock((FlagRegistry *)i._M_node);
  iVar3 = std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
          begin(OUTPUT);
  iVar4 = std::vector<gflags::CommandLineFlagInfo,_std::allocator<gflags::CommandLineFlagInfo>_>::
          end(OUTPUT);
  std::
  sort<__gnu_cxx::__normal_iterator<gflags::CommandLineFlagInfo*,std::vector<gflags::CommandLineFlagInfo,std::allocator<gflags::CommandLineFlagInfo>>>,gflags::FilenameFlagnameCmp>
            (iVar3._M_current,iVar4._M_current);
  return;
}

Assistant:

void GetAllFlags(vector<CommandLineFlagInfo>* OUTPUT) {
  FlagRegistry* const registry = FlagRegistry::GlobalRegistry();
  registry->Lock();
  for (FlagRegistry::FlagConstIterator i = registry->flags_.begin();
       i != registry->flags_.end(); ++i) {
    CommandLineFlagInfo fi;
    i->second->FillCommandLineFlagInfo(&fi);
    OUTPUT->push_back(fi);
  }
  registry->Unlock();
  // Now sort the flags, first by filename they occur in, then alphabetically
  sort(OUTPUT->begin(), OUTPUT->end(), FilenameFlagnameCmp());
}